

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O2

boolean teleport_pet(monst *mtmp,boolean force_it)

{
  obj *poVar1;
  boolean bVar2;
  
  if (u.usteed == mtmp) {
LAB_00248042:
    bVar2 = '\0';
  }
  else {
    bVar2 = '\x01';
    if ((mtmp->field_0x63 & 1) == 0) {
      return '\x01';
    }
    poVar1 = get_mleash(mtmp);
    if (poVar1 == (obj *)0x0) {
      Monnam(mtmp);
      warning("%s is leashed, without a leash.");
    }
    else {
      if ((force_it == '\0') && ((*(uint *)&poVar1->field_0x4a & 1) != 0)) {
        yelp(mtmp);
        goto LAB_00248042;
      }
      pline("Your leash goes slack.");
    }
    m_unleash(mtmp,'\0');
  }
  return bVar2;
}

Assistant:

boolean teleport_pet(struct monst *mtmp, boolean force_it)
{
	struct obj *otmp;

	if (mtmp == u.usteed)
		return FALSE;

	if (mtmp->mleashed) {
	    otmp = get_mleash(mtmp);
	    if (!otmp) {
		warning("%s is leashed, without a leash.", Monnam(mtmp));
		goto release_it;
	    }
	    if (otmp->cursed && !force_it) {
		yelp(mtmp);
		return FALSE;
	    } else {
		pline("Your leash goes slack.");
 release_it:
		m_unleash(mtmp, FALSE);
		return TRUE;
	    }
	}
	return TRUE;
}